

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O1

int64_t pick_interinter_seg(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,uint8_t *p0,uint8_t *p1,
                           int16_t *residual1,int16_t *diff10,uint64_t *best_sse)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint uVar4;
  MB_MODE_INFO *pMVar5;
  int iVar6;
  uint64_t uVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  undefined7 in_register_00000011;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  ulong local_80b8;
  uint8_t *tmp_mask [2];
  double dist_by_sse_norm_f;
  double rate_f;
  uint8_t seg_mask [32768];
  
  uVar14 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  bVar1 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[uVar14];
  iVar12 = 1 << (bVar1 & 0x1f);
  uVar4 = ((x->e_mbd).cur_buf)->flags;
  bVar9 = 0;
  if ((uVar4 & 8) != 0) {
    bVar9 = (char)(x->e_mbd).bd * '\x02' - 0x10;
  }
  pMVar5 = *(x->e_mbd).mi;
  uVar2 = block_size_wide[uVar14];
  uVar3 = block_size_high[uVar14];
  tmp_mask[0] = (x->e_mbd).seg_mask;
  tmp_mask[1] = seg_mask;
  dVar16 = (double)iVar12;
  lVar13 = 0x7fffffffffffffff;
  uVar14 = 0;
  local_80b8 = 0;
  do {
    iVar6 = (int)uVar2;
    if ((uVar4 & 8) == 0) {
      (*av1_build_compound_diffwtd_mask)
                (tmp_mask[uVar14],(DIFFWTD_MASK_TYPE)uVar14,p0,iVar6,p1,iVar6,(int)uVar3,iVar6);
    }
    else {
      (*av1_build_compound_diffwtd_mask_highbd)
                (tmp_mask[uVar14],(DIFFWTD_MASK_TYPE)uVar14,(uint8_t *)((ulong)p0 >> 1),iVar6,
                 (uint8_t *)((ulong)p1 >> 1),iVar6,(int)uVar3,iVar6,(x->e_mbd).bd);
    }
    uVar7 = (*av1_wedge_sse_from_residuals)(residual1,diff10,tmp_mask[uVar14],iVar12);
    uVar15 = uVar7 + (long)((1 << (bVar9 & 0x1f)) >> 1) >> (bVar9 & 0x3f);
    bVar10 = 3;
    if ((((x->e_mbd).cur_buf)->flags & 8) != 0) {
      bVar10 = (char)(x->e_mbd).bd - 5;
    }
    if (uVar15 == 0) {
      lVar8 = 0;
      lVar11 = 0;
    }
    else {
      iVar6 = (int)x->plane[0].dequant_QTX[1] >> (bVar10 & 0x1f);
      if (iVar6 < 2) {
        iVar6 = 1;
      }
      dVar17 = (double)(long)uVar15 / dVar16;
      dVar18 = log2(dVar17 / ((double)iVar6 * (double)iVar6));
      av1_model_rd_curvfit(bsize,dVar17,dVar18,&rate_f,&dist_by_sse_norm_f);
      dVar18 = 0.0;
      if (0.0 <= rate_f * dVar16) {
        dVar18 = rate_f * dVar16;
      }
      if ((int)(dVar18 + 0.5) == 0) {
        lVar8 = 0;
        lVar11 = uVar15 << 4;
      }
      else {
        dVar19 = dVar17 * dist_by_sse_norm_f * dVar16;
        dVar17 = 0.0;
        if (0.0 <= dVar19) {
          dVar17 = dVar19;
        }
        lVar11 = (long)(dVar17 + 0.5);
        lVar8 = (long)(int)(dVar18 + 0.5);
        if ((long)(uVar15 * 0x800) <= lVar11 * 0x80 + (x->rdmult * lVar8 + 0x100 >> 9)) {
          lVar8 = 0;
          lVar11 = uVar15 << 4;
        }
      }
      lVar11 = lVar11 << 7;
    }
    lVar11 = (x->rdmult * lVar8 + 0x100 >> 9) + lVar11;
    if (lVar11 < lVar13) {
      *best_sse = uVar15;
      local_80b8 = uVar14 & 0xffffffff;
      lVar13 = lVar11;
    }
    uVar14 = uVar14 + 1;
  } while (uVar14 == 1);
  (pMVar5->interinter_comp).mask_type = (DIFFWTD_MASK_TYPE)local_80b8;
  if ((DIFFWTD_MASK_TYPE)local_80b8 == '\x01') {
    memcpy((x->e_mbd).seg_mask,seg_mask,(long)(2 << (bVar1 & 0x1f)));
  }
  return lVar13;
}

Assistant:

static int64_t pick_interinter_seg(const AV1_COMP *const cpi,
                                   MACROBLOCK *const x, const BLOCK_SIZE bsize,
                                   const uint8_t *const p0,
                                   const uint8_t *const p1,
                                   const int16_t *const residual1,
                                   const int16_t *const diff10,
                                   uint64_t *best_sse) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int N = 1 << num_pels_log2_lookup[bsize];
  int rate;
  int64_t dist;
  DIFFWTD_MASK_TYPE cur_mask_type;
  int64_t best_rd = INT64_MAX;
  DIFFWTD_MASK_TYPE best_mask_type = 0;
  const int hbd = is_cur_buf_hbd(xd);
  const int bd_round = hbd ? (xd->bd - 8) * 2 : 0;
  DECLARE_ALIGNED(16, uint8_t, seg_mask[2 * MAX_SB_SQUARE]);
  uint8_t *tmp_mask[2] = { xd->seg_mask, seg_mask };
  // try each mask type and its inverse
  for (cur_mask_type = 0; cur_mask_type < DIFFWTD_MASK_TYPES; cur_mask_type++) {
    // build mask and inverse
#if CONFIG_AV1_HIGHBITDEPTH
    if (hbd)
      av1_build_compound_diffwtd_mask_highbd(
          tmp_mask[cur_mask_type], cur_mask_type, CONVERT_TO_BYTEPTR(p0), bw,
          CONVERT_TO_BYTEPTR(p1), bw, bh, bw, xd->bd);
    else
      av1_build_compound_diffwtd_mask(tmp_mask[cur_mask_type], cur_mask_type,
                                      p0, bw, p1, bw, bh, bw);
#else
    (void)hbd;
    av1_build_compound_diffwtd_mask(tmp_mask[cur_mask_type], cur_mask_type, p0,
                                    bw, p1, bw, bh, bw);
#endif  // CONFIG_AV1_HIGHBITDEPTH

    // compute rd for mask
    uint64_t sse = av1_wedge_sse_from_residuals(residual1, diff10,
                                                tmp_mask[cur_mask_type], N);
    sse = ROUND_POWER_OF_TWO(sse, bd_round);

    model_rd_sse_fn[MODELRD_TYPE_MASKED_COMPOUND](cpi, x, bsize, 0, sse, N,
                                                  &rate, &dist);
    const int64_t rd0 = RDCOST(x->rdmult, rate, dist);

    if (rd0 < best_rd) {
      best_mask_type = cur_mask_type;
      best_rd = rd0;
      *best_sse = sse;
    }
  }
  mbmi->interinter_comp.mask_type = best_mask_type;
  if (best_mask_type == DIFFWTD_38_INV) {
    memcpy(xd->seg_mask, seg_mask, N * 2);
  }
  return best_rd;
}